

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.cc
# Opt level: O0

Var __thiscall Glucose::Solver::newVar(Solver *this,bool sign,bool dvar)

{
  OccLists<Glucose::Lit,_Glucose::vec<Glucose::Solver::Watcher>,_Glucose::Solver::WatcherDeleted>
  *this_00;
  OccLists<Glucose::Lit,_Glucose::vec<Glucose::Solver::Watcher>,_Glucose::Solver::WatcherDeleted>
  *this_01;
  Solver *this_02;
  byte in_DL;
  byte in_SIL;
  long in_RDI;
  double dVar1;
  double *elem;
  int v;
  VarData *in_stack_ffffffffffffff58;
  int min_cap;
  lbool local_29;
  int local_28;
  int local_24;
  int local_20;
  int local_1c;
  int local_18;
  int local_14;
  int local_10;
  byte local_a;
  byte local_9;
  
  local_9 = in_SIL & 1;
  local_a = in_DL & 1;
  local_10 = nVars((Solver *)0x112609);
  this_00 = (OccLists<Glucose::Lit,_Glucose::vec<Glucose::Solver::Watcher>,_Glucose::Solver::WatcherDeleted>
             *)(in_RDI + 0x160);
  local_14 = (int)mkLit(local_10,false);
  OccLists<Glucose::Lit,_Glucose::vec<Glucose::Solver::Watcher>,_Glucose::Solver::WatcherDeleted>::
  init(this_00,(EVP_PKEY_CTX *)&local_14);
  this_01 = (OccLists<Glucose::Lit,_Glucose::vec<Glucose::Solver::Watcher>,_Glucose::Solver::WatcherDeleted>
             *)(in_RDI + 0x160);
  local_18 = (int)mkLit(local_10,true);
  OccLists<Glucose::Lit,_Glucose::vec<Glucose::Solver::Watcher>,_Glucose::Solver::WatcherDeleted>::
  init(this_01,(EVP_PKEY_CTX *)&local_18);
  this_02 = (Solver *)(in_RDI + 0x198);
  local_1c = (int)mkLit(local_10,false);
  OccLists<Glucose::Lit,_Glucose::vec<Glucose::Solver::Watcher>,_Glucose::Solver::WatcherDeleted>::
  init((OccLists<Glucose::Lit,_Glucose::vec<Glucose::Solver::Watcher>,_Glucose::Solver::WatcherDeleted>
        *)this_02,(EVP_PKEY_CTX *)&local_1c);
  local_20 = (int)mkLit(local_10,true);
  OccLists<Glucose::Lit,_Glucose::vec<Glucose::Solver::Watcher>,_Glucose::Solver::WatcherDeleted>::
  init((OccLists<Glucose::Lit,_Glucose::vec<Glucose::Solver::Watcher>,_Glucose::Solver::WatcherDeleted>
        *)(in_RDI + 0x198),(EVP_PKEY_CTX *)&local_20);
  local_24 = (int)mkLit(local_10,false);
  OccLists<Glucose::Lit,_Glucose::vec<Glucose::Solver::Watcher>,_Glucose::Solver::WatcherDeleted>::
  init((OccLists<Glucose::Lit,_Glucose::vec<Glucose::Solver::Watcher>,_Glucose::Solver::WatcherDeleted>
        *)(in_RDI + 0x1d0),(EVP_PKEY_CTX *)&local_24);
  local_28 = (int)mkLit(local_10,true);
  OccLists<Glucose::Lit,_Glucose::vec<Glucose::Solver::Watcher>,_Glucose::Solver::WatcherDeleted>::
  init((OccLists<Glucose::Lit,_Glucose::vec<Glucose::Solver::Watcher>,_Glucose::Solver::WatcherDeleted>
        *)(in_RDI + 0x1d0),(EVP_PKEY_CTX *)&local_28);
  lbool::lbool(&local_29,'\x02');
  vec<Glucose::lbool>::push((vec<Glucose::lbool> *)this_00,(lbool *)in_stack_ffffffffffffff58);
  mkVarData(0xffffffff,0);
  vec<Glucose::Solver::VarData>::push
            ((vec<Glucose::Solver::VarData> *)this_00,in_stack_ffffffffffffff58);
  if ((*(byte *)(in_RDI + 0xa9) & 1) == 0) {
    elem = (double *)0x0;
  }
  else {
    dVar1 = drand((double *)(in_RDI + 0x98));
    elem = (double *)(dVar1 * 1e-05);
  }
  vec<double>::push((vec<double> *)this_00,elem);
  vec<char>::push((vec<char> *)this_00,(char *)elem);
  vec<unsigned_int>::push((vec<unsigned_int> *)this_00,(uint *)elem);
  vec<char>::push((vec<char> *)this_00,(char *)elem);
  vec<char>::push((vec<char> *)this_00,(char *)elem);
  min_cap = (int)((ulong)elem >> 0x20);
  vec<char>::push((vec<char> *)this_00);
  vec<Glucose::Lit>::capacity((vec<Glucose::Lit> *)this_00,min_cap);
  setDecisionVar(this_02,(Var)((ulong)this_01 >> 0x20),SUB81((ulong)this_01 >> 0x18,0));
  return local_10;
}

Assistant:

Var Solver::newVar(bool sign, bool dvar) {
    int v = nVars();
    watches.init(mkLit(v, false));
    watches.init(mkLit(v, true));
    watchesBin.init(mkLit(v, false));
    watchesBin.init(mkLit(v, true));
    unaryWatches.init(mkLit(v, false));
    unaryWatches.init(mkLit(v, true));
    assigns.push(l_Undef);
    vardata.push(mkVarData(CRef_Undef, 0));
    activity.push(rnd_init_act ? drand(random_seed) * 0.00001 : 0);
    seen.push(0);
    permDiff.push(0);
    polarity.push(sign);
    forceUNSAT.push(0);
    decision.push();
    trail.capacity(v + 1);
    setDecisionVar(v, dvar);
    return v;
}